

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceTextModuleRecord.cpp
# Opt level: O3

bool __thiscall
Js::SourceTextModuleRecord::ResolveExport
          (SourceTextModuleRecord *this,PropertyId exportName,ResolveSet *resolveSet,
          ModuleNameRecord **exportRecord)

{
  Type *addr;
  SourceTextModuleRecord *pSVar1;
  IdentPtr pIVar2;
  IdentPtr pIVar3;
  IdentPtr pIVar4;
  code *pcVar5;
  ModuleNameRecord **ppMVar6;
  bool bVar7;
  uint uVar8;
  Type localName;
  int iVar9;
  BaseDictionary<int,_Js::ModuleNameRecord,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar10;
  undefined4 *puVar11;
  ModuleRecordBase *pMVar12;
  Type *pTVar13;
  Type *pTVar14;
  SourceTextModuleRecord *pSVar15;
  SourceTextModuleRecord *pSVar16;
  ArenaAllocator *alloc;
  undefined1 *puVar17;
  SourceTextModuleRecord *local_68;
  ModuleNameRecord *importRecord;
  ModuleNameRecord **local_58;
  undefined1 local_50 [8];
  int i;
  undefined4 uStack_44;
  SourceTextModuleRecord *local_40;
  uint local_34 [2];
  PropertyId exportName_local;
  
  alloc = &((this->scriptContext).ptr)->generalAllocator;
  pBVar10 = (this->resolvedExportMap).ptr;
  local_58 = exportRecord;
  local_40 = this;
  local_34[0] = exportName;
  if (pBVar10 ==
      (BaseDictionary<int,_Js::ModuleNameRecord,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
       *)0x0) {
    addr = &this->resolvedExportMap;
    pBVar10 = (BaseDictionary<int,_Js::ModuleNameRecord,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               *)new<Memory::ArenaAllocator>(0x38,alloc,0x364470);
    pBVar10->buckets = (Type)0x0;
    pBVar10->entries = (Type)0x0;
    pBVar10->alloc = alloc;
    pBVar10->size = 0;
    pBVar10->bucketCount = 0;
    pBVar10->count = 0;
    pBVar10->freeCount = 0;
    pBVar10->modFunctionIndex = 0x4b;
    pBVar10->stats = (Type)0x0;
    Memory::Recycler::WBSetBit((char *)addr);
    addr->ptr = pBVar10;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    pBVar10 = addr->ptr;
  }
  bVar7 = JsUtil::
          BaseDictionary<int,_Js::ModuleNameRecord,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::TryGetReference<int>(pBVar10,(int *)local_34,local_58,(int *)local_50);
  if (bVar7) {
    return true;
  }
  if (resolveSet == (ResolveSet *)0x0) {
    resolveSet = (ResolveSet *)new<Memory::ArenaAllocator>(0x18,alloc,0x364470);
    (((SListBase<Js::ModuleNameRecord,_Memory::ArenaAllocator,_RealCount> *)
     &((ModuleRecordBase *)resolveSet)->super_FinalizableObject)->
    super_SListNodeBase<Memory::ArenaAllocator>).next = (Type)resolveSet;
    ((RealCount *)&((ModuleRecordBase *)resolveSet)->magicNumber)->count = 0;
    (((ModuleRecordBase *)resolveSet)->namespaceObject).ptr = (ModuleNamespace *)alloc;
  }
  *local_58 = (ModuleNameRecord *)0x0;
  local_50 = (undefined1  [8])resolveSet;
  _i = (ModuleRecordBase *)resolveSet;
  puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  pMVar12 = (ModuleRecordBase *)resolveSet;
  while( true ) {
    if (pMVar12 == (ModuleRecordBase *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar11 = 1;
      bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                  ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar7) goto LAB_00b0537f;
      *puVar11 = 0;
      pMVar12 = _i;
    }
    uVar8 = local_34[0];
    pMVar12 = (ModuleRecordBase *)
              (((SListBase<Js::ModuleNameRecord,_Memory::ArenaAllocator,_RealCount> *)
               &pMVar12->super_FinalizableObject)->super_SListNodeBase<Memory::ArenaAllocator>).next
    ;
    if ((undefined1  [8])pMVar12 == local_50) break;
    _i = pMVar12;
    pTVar13 = SListBase<Js::ModuleNameRecord,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                        ((Iterator *)local_50);
    pSVar1 = (SourceTextModuleRecord *)(pTVar13->module).ptr;
    Memory::Recycler::WBSetBit((char *)&local_68);
    local_68 = pSVar1;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_68);
    importRecord._0_4_ = pTVar13->bindingName;
    pMVar12 = _i;
    if ((local_68 == local_40) && (local_34[0] == (uint)importRecord)) {
      *local_58 = (ModuleNameRecord *)0x0;
      return true;
    }
  }
  Memory::Recycler::WBSetBit((char *)local_50);
  pSVar1 = local_40;
  local_50 = (undefined1  [8])local_40;
  Memory::RecyclerWriteBarrierManager::WriteBarrier((ModuleNameRecord *)local_50);
  _i = (ModuleRecordBase *)CONCAT44(uStack_44,uVar8);
  SListBase<Js::ModuleNameRecord,_Memory::ArenaAllocator,_RealCount>::Prepend
            (&resolveSet->super_SListBase<Js::ModuleNameRecord,_Memory::ArenaAllocator,_RealCount>,
             (ArenaAllocator *)(((ModuleRecordBase *)resolveSet)->namespaceObject).ptr,
             (ModuleNameRecord *)local_50);
  local_50 = (undefined1  [8])(pSVar1->localExportRecordList).ptr;
  if (local_50 != (undefined1  [8])0x0) {
    _i = (ModuleRecordBase *)local_50;
    do {
      if (_i == (ModuleRecordBase *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar11 = 1;
        bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                    ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar7) goto LAB_00b0537f;
        *puVar11 = 0;
      }
      _i = (ModuleRecordBase *)
           (((SListBase<Js::ModuleNameRecord,_Memory::ArenaAllocator,_RealCount> *)
            &_i->super_FinalizableObject)->super_SListNodeBase<Memory::ArenaAllocator>).next;
      if ((undefined1  [8])_i == local_50) goto LAB_00b050a1;
      pTVar14 = SListBase<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount>::Iterator::
                Data((Iterator *)local_50);
      pIVar2 = pTVar14->localName;
      pIVar3 = pTVar14->exportName;
      uVar8 = pIVar3->m_propertyId;
      if (uVar8 == 0xffffffff) {
        uVar8 = ScriptContext::GetOrAddPropertyIdTracked
                          ((local_40->scriptContext).ptr,(LPCWSTR)&pIVar3->field_0x22,pIVar3->m_cch)
        ;
        pIVar3->m_propertyId = uVar8;
      }
    } while (uVar8 != local_34[0]);
    localName = pIVar2->m_propertyId;
    if (localName == 0xffffffff) {
      localName = ScriptContext::GetOrAddPropertyIdTracked
                            ((local_40->scriptContext).ptr,(LPCWSTR)&pIVar2->field_0x22,
                             pIVar2->m_cch);
      pIVar2->m_propertyId = localName;
      if (localName == 0xffffffff) goto LAB_00b050a1;
    }
    pSVar1 = local_40;
    local_68 = (SourceTextModuleRecord *)0x0;
    pSVar15 = pSVar1;
    if (((local_40->importRecordList).ptr !=
         (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)0x0) &&
       (bVar7 = ResolveImport(local_40,localName,(ModuleNameRecord **)&local_68),
       local_68 != (SourceTextModuleRecord *)0x0 && bVar7)) {
      localName = (local_68->super_ModuleRecordBase).magicNumber;
      pSVar15 = (SourceTextModuleRecord *)
                (local_68->super_ModuleRecordBase).super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject;
    }
    pBVar10 = (pSVar1->resolvedExportMap).ptr;
    Memory::Recycler::WBSetBit((char *)local_50);
    local_50 = (undefined1  [8])pSVar15;
    Memory::RecyclerWriteBarrierManager::WriteBarrier((ModuleNameRecord *)local_50);
    _i = (ModuleRecordBase *)CONCAT44(uStack_44,localName);
    JsUtil::
    BaseDictionary<int,Js::ModuleNameRecord,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<int,Js::ModuleNameRecord,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
              ((BaseDictionary<int,Js::ModuleNameRecord,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)pBVar10,(int *)local_34,(ModuleNameRecord *)local_50);
    JsUtil::
    BaseDictionary<int,_Js::ModuleNameRecord,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::TryGetReference<int>((pSVar1->resolvedExportMap).ptr,(int *)local_34,local_58,(int *)local_50)
    ;
    return true;
  }
LAB_00b050a1:
  local_50 = (undefined1  [8])(local_40->indirectExportRecordList).ptr;
  if (local_50 != (undefined1  [8])0x0) {
    _i = (ModuleRecordBase *)local_50;
    while( true ) {
      if (_i == (ModuleRecordBase *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar11 = 1;
        bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                    ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar7) goto LAB_00b0537f;
        *puVar11 = 0;
      }
      _i = (ModuleRecordBase *)
           (((SListBase<Js::ModuleNameRecord,_Memory::ArenaAllocator,_RealCount> *)
            &_i->super_FinalizableObject)->super_SListNodeBase<Memory::ArenaAllocator>).next;
      if ((undefined1  [8])_i == local_50) break;
      pTVar14 = SListBase<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount>::Iterator::
                Data((Iterator *)local_50);
      pIVar2 = pTVar14->moduleRequest;
      pIVar3 = pTVar14->importName;
      pIVar4 = pTVar14->exportName;
      uVar8 = pIVar4->m_propertyId;
      if (uVar8 == 0xffffffff) {
        uVar8 = ScriptContext::GetOrAddPropertyIdTracked
                          ((local_40->scriptContext).ptr,(LPCWSTR)&pIVar4->field_0x22,pIVar4->m_cch)
        ;
        pIVar4->m_propertyId = uVar8;
      }
      if (local_34[0] == uVar8) {
        uVar8 = pIVar3->m_propertyId;
        if (uVar8 == 0xffffffff) {
          uVar8 = ScriptContext::GetOrAddPropertyIdTracked
                            ((local_40->scriptContext).ptr,(LPCWSTR)&pIVar3->field_0x22,
                             pIVar3->m_cch);
          pIVar3->m_propertyId = uVar8;
        }
        puVar17 = &pIVar2->field_0x22;
        pSVar15 = GetChildModuleRecord(local_40,(LPCOLESTR)puVar17);
        pSVar1 = local_40;
        ppMVar6 = local_58;
        if (pSVar15 == (SourceTextModuleRecord *)0x0) {
          ReleaseParserResourcesForHierarchy(local_40);
          JavascriptError::ThrowReferenceError
                    ((pSVar1->scriptContext).ptr,-0x7ff5e9f2,(PCWSTR)puVar17);
        }
        if (pIVar3->m_propertyId == 0x70) {
          *local_58 = &pSVar15->namespaceRecord;
          return true;
        }
        iVar9 = (*(pSVar15->super_ModuleRecordBase).super_FinalizableObject.
                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[9])
                          (pSVar15,(ulong)uVar8,resolveSet,local_58);
        if ((char)iVar9 == '\0') {
          return false;
        }
        if (*ppMVar6 != (ModuleNameRecord *)0x0) {
          return true;
        }
      }
    }
    if (*local_58 != (ModuleNameRecord *)0x0) {
      return true;
    }
  }
  if (local_34[0] != 0x6e) {
    local_50 = (undefined1  [8])(local_40->starExportRecordList).ptr;
    if (local_50 == (undefined1  [8])0x0) {
      return true;
    }
    pSVar1 = (SourceTextModuleRecord *)0x0;
    _i = (ModuleRecordBase *)local_50;
    do {
      pSVar15 = pSVar1;
      if (_i == (ModuleRecordBase *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar11 = 1;
        bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                    ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar7) {
LAB_00b0537f:
          pcVar5 = (code *)invalidInstructionException();
          (*pcVar5)();
        }
        *puVar11 = 0;
      }
      _i = (ModuleRecordBase *)
           (((SListBase<Js::ModuleNameRecord,_Memory::ArenaAllocator,_RealCount> *)
            &_i->super_FinalizableObject)->super_SListNodeBase<Memory::ArenaAllocator>).next;
      if ((undefined1  [8])_i == local_50) goto LAB_00b05376;
      pTVar14 = SListBase<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount>::Iterator::
                Data((Iterator *)local_50);
      local_68 = (SourceTextModuleRecord *)0x0;
      puVar17 = &pTVar14->moduleRequest->field_0x22;
      pSVar16 = GetChildModuleRecord(local_40,(LPCOLESTR)puVar17);
      pSVar1 = local_40;
      if (pSVar16 == (SourceTextModuleRecord *)0x0) {
        ReleaseParserResourcesForHierarchy(local_40);
        JavascriptError::ThrowReferenceError
                  ((pSVar1->scriptContext).ptr,-0x7ff5e9f2,(PCWSTR)puVar17);
      }
      if ((pSVar16->errorObject).ptr != (void *)0x0) {
        ReleaseParserResourcesForHierarchy(local_40);
        JavascriptExceptionOperators::Throw((pSVar16->errorObject).ptr,(pSVar1->scriptContext).ptr);
      }
      iVar9 = (*(pSVar16->super_ModuleRecordBase).super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[9])
                        (pSVar16,(ulong)local_34[0],resolveSet,&local_68);
      if ((char)iVar9 == '\0') {
        return false;
      }
      pSVar1 = pSVar15;
    } while ((local_68 == (SourceTextModuleRecord *)0x0) ||
            (pSVar1 = local_68, pSVar15 == (SourceTextModuleRecord *)0x0));
    if (((local_68->super_ModuleRecordBase).magicNumber ==
         (pSVar15->super_ModuleRecordBase).magicNumber) &&
       ((local_68->super_ModuleRecordBase).super_FinalizableObject.super_IRecyclerVisitedObject.
        _vptr_IRecyclerVisitedObject ==
        (pSVar15->super_ModuleRecordBase).super_FinalizableObject.super_IRecyclerVisitedObject.
        _vptr_IRecyclerVisitedObject)) {
LAB_00b05376:
      *local_58 = (ModuleNameRecord *)pSVar15;
      return true;
    }
  }
  return false;
}

Assistant:

bool SourceTextModuleRecord::ResolveExport(PropertyId exportName, ResolveSet* resolveSet, ModuleNameRecord** exportRecord)
    {
        ArenaAllocator* allocator = scriptContext->GeneralAllocator();
        if (resolvedExportMap == nullptr)
        {
            resolvedExportMap = Anew(allocator, ResolvedExportMap, allocator);
        }
        if (resolvedExportMap->TryGetReference(exportName, exportRecord))
        {
            return true;
        }
        // TODO: use per-call/loop allocator?
        if (resolveSet == nullptr)
        {
            resolveSet = Anew(allocator, ResolveSet, allocator);
        }

        *exportRecord = nullptr;
        bool hasCircularRef = false;
        resolveSet->MapUntil([&](ModuleNameRecord moduleNameRecord) {
            if (moduleNameRecord.module == this && moduleNameRecord.bindingName == exportName)
            {
                *exportRecord = nullptr;
                hasCircularRef = true;
                return true;
            }
            return false;
        });
        if (hasCircularRef)
        {
            Assert(*exportRecord == nullptr);
            return true;
        }
        resolveSet->Prepend(ModuleNameRecord(this, exportName));

        if (localExportRecordList != nullptr)
        {
            PropertyId localNameId = Js::Constants::NoProperty;
            localExportRecordList->MapUntil([&](ModuleImportOrExportEntry exportEntry) {
                PropertyId exportNameId = EnsurePropertyIdForIdentifier(exportEntry.exportName);
                if (exportNameId == exportName)
                {
                    localNameId = EnsurePropertyIdForIdentifier(exportEntry.localName);
                    return true;
                }
                return false;
            });
            if (localNameId != Js::Constants::NoProperty)
            {
                // Check to see if we are exporting something we imported from another module without using a re-export.
                // ex: import { foo } from 'module'; export { foo };
                ModuleRecordBase* sourceModule = this;
                ModuleNameRecord* importRecord = nullptr;
                if (this->importRecordList != nullptr
                    && this->ResolveImport(localNameId, &importRecord)
                    && importRecord != nullptr)
                {
                    sourceModule = importRecord->module;
                    localNameId = importRecord->bindingName;
                }
                resolvedExportMap->AddNew(exportName, { sourceModule, localNameId });
                // return the address from Map buffer.
                resolvedExportMap->TryGetReference(exportName, exportRecord);
                return true;
            }
        }

        if (indirectExportRecordList != nullptr)
        {
            bool isAmbiguous = false;
            indirectExportRecordList->MapUntil([&](ModuleImportOrExportEntry exportEntry) {
                PropertyId reexportNameId = EnsurePropertyIdForIdentifier(exportEntry.exportName);
                if (exportName != reexportNameId)
                {
                    return false;
                }

                PropertyId importNameId = EnsurePropertyIdForIdentifier(exportEntry.importName);
                SourceTextModuleRecord* childModuleRecord = GetChildModuleRecord(exportEntry.moduleRequest->Psz());
                if (childModuleRecord == nullptr)
                {
                    this->ReleaseParserResourcesForHierarchy();
                    JavascriptError::ThrowReferenceError(scriptContext, JSERR_CannotResolveModule, exportEntry.moduleRequest->Psz());
                }

                if (exportEntry.importName->GetPropertyId() == PropertyIds::star_)
                {
                    // export * as someName from "foo"
                    *exportRecord = childModuleRecord->GetNamespaceNameRecord();
                    return true;
                }

                isAmbiguous = !childModuleRecord->ResolveExport(importNameId, resolveSet, exportRecord);
                if (isAmbiguous)
                {
                    // ambiguous; don't need to search further
                    return true;
                }

                // found a resolution. done;
                if (*exportRecord != nullptr)
                {
                    return true;
                }
                return false;
            });
            if (isAmbiguous)
            {
                return false;
            }
            if (*exportRecord != nullptr)
            {
                return true;
            }
        }

        if (exportName == PropertyIds::default_)
        {
            return false;
        }

        bool ambiguousResolution = false;
        if (this->starExportRecordList != nullptr)
        {
            ModuleNameRecord* starResolution = nullptr;
            starExportRecordList->MapUntil([&](ModuleImportOrExportEntry starExportEntry) {
                ModuleNameRecord* currentResolution = nullptr;
                SourceTextModuleRecord* childModule = GetChildModuleRecord(starExportEntry.moduleRequest->Psz());
                if (childModule == nullptr)
                {
                    this->ReleaseParserResourcesForHierarchy();
                    JavascriptError::ThrowReferenceError(GetScriptContext(), JSERR_CannotResolveModule, starExportEntry.moduleRequest->Psz());
                }
                if (childModule->errorObject != nullptr)
                {
                    this->ReleaseParserResourcesForHierarchy();
                    JavascriptExceptionOperators::Throw(childModule->errorObject, GetScriptContext());
                }

                // if ambiguous, return "ambiguous"
                if (!childModule->ResolveExport(exportName, resolveSet, &currentResolution))
                {
                    ambiguousResolution = true;
                    return true;
                }
                if (currentResolution != nullptr)
                {
                    if (starResolution == nullptr)
                    {
                        starResolution = currentResolution;
                    }
                    else
                    {
                        if (currentResolution->bindingName != starResolution->bindingName ||
                            currentResolution->module != starResolution->module)
                        {
                            ambiguousResolution = true;
                        }
                        return true;
                    }
                }
                return false;
            });
            if (!ambiguousResolution)
            {
                *exportRecord = starResolution;
            }
        }
        return !ambiguousResolution;
    }